

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_> *this)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  num_writer f;
  char cVar4;
  int iVar5;
  int iVar6;
  _Alloc_hider _Var7;
  uint uVar8;
  int iVar9;
  string_view prefix;
  string groups;
  string local_58;
  ulong local_38;
  int iStack_30;
  undefined4 uStack_2c;
  string *local_28;
  char cStack_20;
  undefined7 uStack_1f;
  
  grouping_impl<char>(&local_58,(locale_ref)(this->writer->locale_).locale_);
  if (local_58._M_string_length == 0) {
    on_dec(this);
    goto LAB_0011739a;
  }
  cVar4 = thousands_sep_impl<char>((locale_ref)(this->writer->locale_).locale_);
  if (cVar4 == '\0') {
    on_dec(this);
    goto LAB_0011739a;
  }
  local_38 = this->abs_value;
  lVar3 = 0x3f;
  if ((local_38 | 1) != 0) {
    for (; (local_38 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  uVar8 = ((uint)lVar3 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  iVar9 = (uVar8 + 1) -
          (uint)(local_38 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar8 * 8)
                );
  pcVar1 = local_58._M_dataplus._M_p + local_58._M_string_length;
  _Var7._M_p = local_58._M_dataplus._M_p;
  iVar5 = iVar9;
  if (local_58._M_string_length == 0) {
LAB_00117342:
    iStack_30 = iVar9;
    iVar6 = iVar5;
    if (_Var7._M_p == pcVar1) goto LAB_0011734c;
  }
  else {
    iStack_30 = iVar9 + (int)local_58._M_string_length;
    do {
      cVar2 = *_Var7._M_p;
      iVar6 = iVar5 - cVar2;
      if ((iVar6 == 0 || iVar5 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) goto LAB_00117342;
      iVar9 = iVar9 + 1;
      _Var7._M_p = _Var7._M_p + 1;
      local_58._M_string_length = local_58._M_string_length - 1;
      iVar5 = iVar6;
    } while (local_58._M_string_length != 0);
LAB_0011734c:
    iStack_30 = (iVar6 + -1) / (int)pcVar1[-1] + iStack_30;
  }
  f._12_4_ = uStack_2c;
  f.size = iStack_30;
  f._25_7_ = uStack_1f;
  f.sep = cVar4;
  f.abs_value = local_38;
  f.groups = &local_58;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  local_28 = &local_58;
  cStack_20 = cVar4;
  basic_writer<fmt::v6::buffer_range<char>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v6::buffer_range<char>> *)this->writer,iStack_30,prefix,*this->specs
             ,f);
LAB_0011739a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }